

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O2

int telemetry_messenger_start
              (TELEMETRY_MESSENGER_HANDLE messenger_handle,SESSION_HANDLE session_handle)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (messenger_handle == (TELEMETRY_MESSENGER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x655;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x655;
    }
    pcVar4 = "telemetry_messenger_start failed (messenger_handle is NULL)";
    iVar2 = 0x656;
  }
  else if (session_handle == (SESSION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x65a;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x65a;
    }
    pcVar4 = "telemetry_messenger_start failed (session_handle is NULL)";
    iVar2 = 0x65b;
  }
  else {
    if (messenger_handle->state == TELEMETRY_MESSENGER_STATE_STOPPED) {
      messenger_handle->session_handle = session_handle;
      update_messenger_state(messenger_handle,TELEMETRY_MESSENGER_STATE_STARTING);
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x663;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x663;
    }
    pcVar4 = 
    "telemetry_messenger_start failed (current state is %d; expected TELEMETRY_MESSENGER_STATE_STOPPED)"
    ;
    iVar2 = 0x664;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
            ,"telemetry_messenger_start",iVar2,1,pcVar4);
  return iVar3;
}

Assistant:

int telemetry_messenger_start(TELEMETRY_MESSENGER_HANDLE messenger_handle, SESSION_HANDLE session_handle)
{
    int result;

    if (messenger_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("telemetry_messenger_start failed (messenger_handle is NULL)");
    }
    else if (session_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("telemetry_messenger_start failed (session_handle is NULL)");
    }
    else
    {
        TELEMETRY_MESSENGER_INSTANCE* instance = (TELEMETRY_MESSENGER_INSTANCE*)messenger_handle;

        if (instance->state != TELEMETRY_MESSENGER_STATE_STOPPED)
        {
            result = MU_FAILURE;
            LogError("telemetry_messenger_start failed (current state is %d; expected TELEMETRY_MESSENGER_STATE_STOPPED)", instance->state);
        }
        else
        {
            instance->session_handle = session_handle;

            update_messenger_state(instance, TELEMETRY_MESSENGER_STATE_STARTING);

            result = RESULT_OK;
        }
    }

    return result;
}